

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunction *
duckdb::SubtractFunction::GetFunction(ScalarFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType varargs;
  LogicalType varargs_00;
  BaseScalarFunction *this;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc4;
  FunctionNullHandling FVar1;
  bind_lambda_function_t in_stack_fffffffffffffcd8;
  LogicalType local_320;
  scalar_function_t local_308;
  LogicalType local_2e8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2d0;
  LogicalType local_2b8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_2a0;
  LogicalType local_288;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_270;
  _Any_data local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  LogicalType local_238;
  scalar_function_t local_220;
  string local_200;
  LogicalType local_1e0;
  string local_1c8;
  LogicalType local_1a8;
  string local_190;
  BaseScalarFunction local_170;
  BaseScalarFunction local_c0;
  
  if (type->id_ == DECIMAL) {
    ::std::__cxx11::string::string((string *)&local_1c8,"-",(allocator *)&stack0xfffffffffffffcdf);
    LogicalType::LogicalType(&local_320,type);
    __l_00._M_len = 1;
    __l_00._M_array = &local_320;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_2a0,__l_00,(allocator_type *)&stack0xfffffffffffffcde);
    LogicalType::LogicalType(&local_2b8,type);
    local_248 = 0;
    uStack_240 = 0;
    local_258._M_unused._M_object = (void *)0x0;
    local_258._8_8_ = 0;
    FVar1 = 0x6e;
    LogicalType::LogicalType(&local_1e0,INVALID);
    ScalarFunction::ScalarFunction
              (__return_storage_ptr__,&local_1c8,(vector<duckdb::LogicalType,_true> *)&local_2a0,
               &local_2b8,(scalar_function_t *)&local_258,DecimalNegateBind,
               (bind_scalar_function_extended_t)0x0,NegateBindStatistics,(init_local_state_t)0x0,
               (LogicalType)ZEXT824(&local_1e0),CONSISTENT,FVar1,in_stack_fffffffffffffcd8);
    LogicalType::~LogicalType(&local_1e0);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_258);
    LogicalType::~LogicalType(&local_2b8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2a0);
    LogicalType::~LogicalType(&local_320);
    ::std::__cxx11::string::~string((string *)&local_1c8);
  }
  else {
    if (type->id_ == INTERVAL) {
      ::std::__cxx11::string::string((string *)&local_190,"-",(allocator *)&stack0xfffffffffffffcdf)
      ;
      LogicalType::LogicalType(&local_320,type);
      __l._M_len = 1;
      __l._M_array = &local_320;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_270,__l,(allocator_type *)&stack0xfffffffffffffcde);
      LogicalType::LogicalType(&local_288,type);
      local_308.super__Function_base._M_functor._8_8_ = 0;
      local_308.super__Function_base._M_functor._M_unused._M_function_pointer =
           ScalarFunction::
           UnaryFunction<duckdb::interval_t,duckdb::interval_t,duckdb::NegateOperator>;
      local_308._M_invoker =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_invoke;
      local_308.super__Function_base._M_manager =
           ::std::
           _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
           ::_M_manager;
      FVar1 = 0x45;
      LogicalType::LogicalType(&local_1a8,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_1a8;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffcbc;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffcc4;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_190,(vector<duckdb::LogicalType,_true> *)&local_270,
                 &local_288,&local_308,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,FVar1,in_stack_fffffffffffffcd8);
      LogicalType::~LogicalType(&local_1a8);
      ::std::_Function_base::~_Function_base(&local_308.super__Function_base);
      LogicalType::~LogicalType(&local_288);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_270);
      LogicalType::~LogicalType(&local_320);
      ::std::__cxx11::string::~string((string *)&local_190);
      BaseScalarFunction::SetReturnsError
                (&local_c0,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_c0;
    }
    else {
      ::std::__cxx11::string::string((string *)&local_200,"-",(allocator *)&stack0xfffffffffffffcdf)
      ;
      LogicalType::LogicalType(&local_320,type);
      __l_01._M_len = 1;
      __l_01._M_array = &local_320;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_2d0,__l_01,(allocator_type *)&stack0xfffffffffffffcde);
      LogicalType::LogicalType(&local_2e8,type);
      ScalarFunction::GetScalarUnaryFunction<duckdb::NegateOperator>(&local_220,type);
      FVar1 = 0x6f;
      LogicalType::LogicalType(&local_238,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_238;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffcbc;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffcc4;
      ScalarFunction::ScalarFunction
                (__return_storage_ptr__,&local_200,(vector<duckdb::LogicalType,_true> *)&local_2d0,
                 &local_2e8,&local_220,(bind_scalar_function_t)0x0,
                 (bind_scalar_function_extended_t)0x0,NegateBindStatistics,(init_local_state_t)0x0,
                 varargs_00,CONSISTENT,FVar1,in_stack_fffffffffffffcd8);
      LogicalType::~LogicalType(&local_238);
      ::std::_Function_base::~_Function_base(&local_220.super__Function_base);
      LogicalType::~LogicalType(&local_2e8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_2d0);
      LogicalType::~LogicalType(&local_320);
      ::std::__cxx11::string::~string((string *)&local_200);
      BaseScalarFunction::SetReturnsError
                (&local_170,&__return_storage_ptr__->super_BaseScalarFunction);
      this = &local_170;
    }
    BaseScalarFunction::~BaseScalarFunction(this);
  }
  return __return_storage_ptr__;
}

Assistant:

ScalarFunction SubtractFunction::GetFunction(const LogicalType &type) {
	if (type.id() == LogicalTypeId::INTERVAL) {
		ScalarFunction func("-", {type}, type, ScalarFunction::UnaryFunction<interval_t, interval_t, NegateOperator>);
		ScalarFunction::SetReturnsError(func);
		return func;
	} else if (type.id() == LogicalTypeId::DECIMAL) {
		ScalarFunction func("-", {type}, type, nullptr, DecimalNegateBind, nullptr, NegateBindStatistics);
		return func;
	} else {
		D_ASSERT(type.IsNumeric());
		ScalarFunction func("-", {type}, type, ScalarFunction::GetScalarUnaryFunction<NegateOperator>(type), nullptr,
		                    nullptr, NegateBindStatistics);
		ScalarFunction::SetReturnsError(func);
		return func;
	}
}